

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O2

void __thiscall DL::Data::Data(Data *this,string_t *key,Integer i)

{
  allocator local_31;
  string_t local_30;
  
  std::__cxx11::string::string((string *)this,(string *)key);
  this->mType = DT_Integer;
  (this->field_2).mInt = i;
  std::__cxx11::string::string((string *)&local_30,"",&local_31);
  DataGroup::DataGroup(&this->mGroup,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->mString)._M_dataplus._M_p = (pointer)&(this->mString).field_2;
  (this->mString)._M_string_length = 0;
  (this->mString).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Data::Data(const string_t& key, Integer i)
	: mKey(key)
	, mType(DT_Integer)
	, mInt(i)
{
}